

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int luv_tcp_keepalive(lua_State *L)

{
  int on;
  uint uVar1;
  uv_tcp_t *handle;
  lua_Integer lVar2;
  int iVar3;
  int in_ESI;
  
  handle = luv_check_tcp(L,in_ESI);
  iVar3 = 1;
  luaL_checktype(L,2,1);
  on = lua_toboolean(L,2);
  if (on == 0) {
    uVar1 = 0;
  }
  else {
    lVar2 = luaL_checkinteger(L,3);
    uVar1 = (uint)lVar2;
  }
  uVar1 = uv_tcp_keepalive(handle,on,uVar1);
  if ((int)uVar1 < 0) {
    iVar3 = 3;
    luv_error(L,uVar1);
  }
  else {
    lua_pushinteger(L,(ulong)uVar1);
  }
  return iVar3;
}

Assistant:

static int luv_tcp_keepalive(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  int ret, enable;
  unsigned int delay = 0;
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  enable = lua_toboolean(L, 2);
  if (enable) {
    delay = luaL_checkinteger(L, 3);
  }
  ret = uv_tcp_keepalive(handle, enable, delay);
  return luv_result(L, ret);
}